

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O1

vorbis_info_floor * floor1_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  uint uVar1;
  int **ppiVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  int *__s;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  vorbis_info_floor1 *info;
  ulong uVar11;
  int iVar12;
  int *piVar13;
  int *sortpointer [65];
  int *local_238 [65];
  
  pvVar3 = vi->codec_setup;
  __s = (int *)calloc(1,0x460);
  lVar6 = oggpack_read(opb,5);
  *__s = (int)lVar6;
  if ((int)lVar6 < 1) {
    iVar12 = -1;
  }
  else {
    uVar11 = 0xffffffff;
    lVar6 = 0;
    do {
      uVar7 = oggpack_read(opb,4);
      iVar12 = (int)uVar7;
      __s[lVar6 + 1] = iVar12;
      if (iVar12 < 0) goto LAB_001e02c3;
      uVar7 = uVar7 & 0xffffffff;
      if (iVar12 < (int)uVar11) {
        uVar7 = uVar11;
      }
      uVar11 = uVar7;
      lVar6 = lVar6 + 1;
      iVar12 = (int)uVar11;
    } while (lVar6 < *__s);
  }
  if (-1 < iVar12) {
    piVar13 = __s + 0x50;
    uVar11 = 0;
    do {
      lVar6 = oggpack_read(opb,3);
      __s[uVar11 + 0x20] = (int)lVar6 + 1;
      lVar6 = oggpack_read(opb,2);
      iVar10 = (int)lVar6;
      __s[uVar11 + 0x30] = iVar10;
      if (iVar10 < 0) goto LAB_001e02c3;
      if (iVar10 != 0) {
        lVar6 = oggpack_read(opb,8);
        __s[uVar11 + 0x40] = (int)lVar6;
      }
      if ((__s[uVar11 + 0x40] < 0) || (*(int *)((long)pvVar3 + 0x20) <= __s[uVar11 + 0x40]))
      goto LAB_001e02c3;
      if (__s[uVar11 + 0x30] != 0x1f) {
        lVar6 = 0;
        do {
          lVar8 = oggpack_read(opb,8);
          iVar10 = (uint)lVar8 - 1;
          piVar13[lVar6] = iVar10;
          if ((0x80000000 < (uint)lVar8) || (*(int *)((long)pvVar3 + 0x20) <= iVar10))
          goto LAB_001e02c3;
          lVar6 = lVar6 + 1;
        } while (lVar6 < 1 << (*(byte *)(__s + uVar11 + 0x30) & 0x1f));
      }
      uVar11 = uVar11 + 1;
      piVar13 = piVar13 + 8;
    } while (uVar11 != iVar12 + 1);
  }
  lVar6 = oggpack_read(opb,2);
  __s[0xd0] = (int)lVar6 + 1;
  lVar6 = oggpack_read(opb,4);
  if (-1 < (int)lVar6) {
    if (*__s < 1) {
      iVar12 = 0;
    }
    else {
      lVar8 = 0;
      iVar10 = 0;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + __s[(long)__s[lVar8 + 1] + 0x20];
        if (0x3f < iVar12) goto LAB_001e02c3;
        if (iVar10 < iVar12) {
          piVar13 = __s + (long)iVar10 + 0xd3;
          do {
            lVar9 = oggpack_read(opb,(int)lVar6);
            iVar5 = (int)lVar9;
            *piVar13 = iVar5;
            if ((iVar5 < 0) || (1 << ((byte)lVar6 & 0x1f) <= iVar5)) goto LAB_001e02c3;
            piVar13 = piVar13 + 1;
            iVar10 = iVar10 + 1;
          } while (iVar12 != iVar10);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < *__s);
    }
    __s[0xd1] = 0;
    __s[0xd2] = 1 << ((byte)lVar6 & 0x1f);
    uVar1 = iVar12 + 2;
    if (-2 < iVar12) {
      uVar11 = 1;
      if (1 < (int)uVar1) {
        uVar11 = (ulong)uVar1;
      }
      lVar6 = 0;
      do {
        *(long *)((long)local_238 + lVar6 * 2) = (long)__s + lVar6 + 0x344;
        lVar6 = lVar6 + 4;
      } while (uVar11 * 4 != lVar6);
    }
    qsort(local_238,(long)(int)uVar1,8,icomp);
    bVar4 = iVar12 >= 0;
    if (iVar12 < 0) {
      return __s;
    }
    uVar11 = 2;
    if (2 < (int)uVar1) {
      uVar11 = (ulong)uVar1;
    }
    if (*local_238[0] != *local_238[1]) {
      lVar6 = 1;
      do {
        if ((2 - uVar11) + lVar6 == 1) {
          return __s;
        }
        ppiVar2 = local_238 + lVar6;
        lVar8 = lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while (**ppiVar2 != *local_238[lVar8]);
      bVar4 = lVar6 < (int)uVar1;
    }
    if (!bVar4) {
      return __s;
    }
  }
LAB_001e02c3:
  memset(__s,0,0x460);
  free(__s);
  return (vorbis_info_floor *)0x0;
}

Assistant:

static vorbis_info_floor *floor1_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=vi->codec_setup;
  int j,k,count=0,maxclass=-1,rangebits;

  vorbis_info_floor1 *info=_ogg_calloc(1,sizeof(*info));
  /* read partitions */
  info->partitions=oggpack_read(opb,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    info->partitionclass[j]=oggpack_read(opb,4); /* only 0 to 15 legal */
    if(info->partitionclass[j]<0)goto err_out;
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* read partition classes */
  for(j=0;j<maxclass+1;j++){
    info->class_dim[j]=oggpack_read(opb,3)+1; /* 1 to 8 */
    info->class_subs[j]=oggpack_read(opb,2); /* 0,1,2,3 bits */
    if(info->class_subs[j]<0)
      goto err_out;
    if(info->class_subs[j])info->class_book[j]=oggpack_read(opb,8);
    if(info->class_book[j]<0 || info->class_book[j]>=ci->books)
      goto err_out;
    for(k=0;k<(1<<info->class_subs[j]);k++){
      info->class_subbook[j][k]=oggpack_read(opb,8)-1;
      if(info->class_subbook[j][k]<-1 || info->class_subbook[j][k]>=ci->books)
        goto err_out;
    }
  }

  /* read the post list */
  info->mult=oggpack_read(opb,2)+1;     /* only 1,2,3,4 legal now */
  rangebits=oggpack_read(opb,4);
  if(rangebits<0)goto err_out;

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]];
    if(count>VIF_POSIT) goto err_out;
    for(;k<count;k++){
      int t=info->postlist[k+2]=oggpack_read(opb,rangebits);
      if(t<0 || t>=(1<<rangebits))
        goto err_out;
    }
  }
  info->postlist[0]=0;
  info->postlist[1]=1<<rangebits;

  /* don't allow repeated values in post list as they'd result in
     zero-length segments */
  {
    int *sortpointer[VIF_POSIT+2];
    for(j=0;j<count+2;j++)sortpointer[j]=info->postlist+j;
    qsort(sortpointer,count+2,sizeof(*sortpointer),icomp);

    for(j=1;j<count+2;j++)
      if(*sortpointer[j-1]==*sortpointer[j])goto err_out;
  }

  return(info);

 err_out:
  floor1_free_info(info);
  return(NULL);
}